

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zet_valddi.cpp
# Opt level: O3

ze_result_t
validation_layer::zetCommandListAppendMarkerExp
          (zet_command_list_handle_t hCommandList,zet_metric_group_handle_t hMetricGroup,
          uint32_t value)

{
  code *pcVar1;
  long lVar2;
  long *plVar3;
  ze_result_t result;
  ze_result_t zVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long *local_68 [2];
  long local_58 [2];
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  
  lVar6 = *(long *)(context + 0xd50);
  local_68[0] = local_58;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_68,"zetCommandListAppendMarkerExp(hCommandList, hMetricGroup, value)",
             "");
  if (*(char *)(lVar6 + 1) == '\x01') {
    local_48 = 0;
    uStack_40 = 0;
    local_38 = 0;
    spdlog::logger::log(*(logger **)(lVar6 + 8),0.0);
  }
  if (local_68[0] != local_58) {
    operator_delete(local_68[0],local_58[0] + 1);
  }
  pcVar1 = *(code **)(context + 0x718);
  if (pcVar1 == (code *)0x0) {
    result = ZE_RESULT_ERROR_UNSUPPORTED_FEATURE;
  }
  else {
    lVar6 = *(long *)(context + 0xd30);
    lVar2 = *(long *)(context + 0xd38);
    lVar7 = lVar2 - lVar6 >> 3;
    if (lVar2 != lVar6) {
      lVar5 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(context + 0xd30) + lVar5 * 8) + 0x10);
        result = (**(code **)(*plVar3 + 0x310))(plVar3,hCommandList,hMetricGroup,value);
        if (result != ZE_RESULT_SUCCESS) goto LAB_0016fd17;
        lVar5 = lVar5 + 1;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar5);
    }
    lVar5 = context;
    if (((*(char *)(context + 4) != '\x01') ||
        (result = ZETHandleLifetimeValidation::zetCommandListAppendMarkerExpPrologue
                            ((ZETHandleLifetimeValidation *)(*(long *)(context + 0xd48) + 0x10),
                             hCommandList,hMetricGroup,value), result == ZE_RESULT_SUCCESS)) &&
       (zVar4 = (*pcVar1)(hCommandList,hMetricGroup,value), result = zVar4, lVar2 != lVar6)) {
      lVar6 = 0;
      do {
        plVar3 = *(long **)(*(long *)(*(long *)(lVar5 + 0xd30) + lVar6 * 8) + 0x10);
        result = (**(code **)(*plVar3 + 0x318))(plVar3,hCommandList,hMetricGroup,value,zVar4);
        if (result != ZE_RESULT_SUCCESS) break;
        lVar6 = lVar6 + 1;
        result = zVar4;
      } while (lVar7 + (ulong)(lVar7 == 0) != lVar6);
    }
  }
LAB_0016fd17:
  logAndPropagateResult("zetCommandListAppendMarkerExp",result);
  return result;
}

Assistant:

__zedlllocal ze_result_t ZE_APICALL
    zetCommandListAppendMarkerExp(
        zet_command_list_handle_t hCommandList,         ///< [in] handle to the command list
        zet_metric_group_handle_t hMetricGroup,         ///< [in] handle to the marker metric group.
                                                        ///< ::zet_metric_group_type_exp_flags_t could be used to check whether
                                                        ///< marker is supoported by the metric group.
        uint32_t value                                  ///< [in] marker value
        )
    {
        context.logger->log_trace("zetCommandListAppendMarkerExp(hCommandList, hMetricGroup, value)");

        auto pfnAppendMarkerExp = context.zetDdiTable.CommandListExp.pfnAppendMarkerExp;

        if( nullptr == pfnAppendMarkerExp )
            return logAndPropagateResult("zetCommandListAppendMarkerExp", ZE_RESULT_ERROR_UNSUPPORTED_FEATURE);

        auto numValHandlers = context.validationHandlers.size();
        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetCommandListAppendMarkerExpPrologue( hCommandList, hMetricGroup, value );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetCommandListAppendMarkerExp", result);
        }


        if( context.enableThreadingValidation ){ 
            //Unimplemented
        }

        
        if(context.enableHandleLifetime ){
            auto result = context.handleLifetime->zetHandleLifetime.zetCommandListAppendMarkerExpPrologue( hCommandList, hMetricGroup, value );
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetCommandListAppendMarkerExp", result);
        }

        auto driver_result = pfnAppendMarkerExp( hCommandList, hMetricGroup, value );

        for (size_t i = 0; i < numValHandlers; i++) {
            auto result = context.validationHandlers[i]->zetValidation->zetCommandListAppendMarkerExpEpilogue( hCommandList, hMetricGroup, value ,driver_result);
            if(result!=ZE_RESULT_SUCCESS) return logAndPropagateResult("zetCommandListAppendMarkerExp", result);
        }

        return logAndPropagateResult("zetCommandListAppendMarkerExp", driver_result);
    }